

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__init_zdefaults(void)

{
  int i;
  
  for (i = 0; i < 0x90; i = i + 1) {
    stbi__zdefault_length[i] = '\b';
  }
  for (; i < 0x100; i = i + 1) {
    stbi__zdefault_length[i] = '\t';
  }
  for (; i < 0x118; i = i + 1) {
    stbi__zdefault_length[i] = '\a';
  }
  for (; i < 0x120; i = i + 1) {
    stbi__zdefault_length[i] = '\b';
  }
  for (i = 0; i < 0x20; i = i + 1) {
    stbi__zdefault_distance[i] = '\x05';
  }
  return;
}

Assistant:

static void stbi__init_zdefaults(void)
{
   int i;   // use <= to match clearly with spec
   for (i=0; i <= 143; ++i)     stbi__zdefault_length[i]   = 8;
   for (   ; i <= 255; ++i)     stbi__zdefault_length[i]   = 9;
   for (   ; i <= 279; ++i)     stbi__zdefault_length[i]   = 7;
   for (   ; i <= 287; ++i)     stbi__zdefault_length[i]   = 8;

   for (i=0; i <=  31; ++i)     stbi__zdefault_distance[i] = 5;
}